

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asStructList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize elementSize)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  BuilderArena *pBVar4;
  StructPointerCount SVar5;
  uint uVar6;
  SegmentBuilder *pSVar7;
  SegmentBuilder *pSVar8;
  ushort uVar9;
  uint uVar10;
  undefined8 *puVar11;
  OrphanBuilder *pOVar12;
  word *pwVar13;
  byte bVar14;
  WirePointer *pWVar15;
  WirePointer *src;
  WirePointer *pWVar16;
  WirePointer *pWVar17;
  int iVar18;
  CapTableBuilder *pCVar19;
  uint uVar20;
  uint uVar21;
  SegmentBuilder **ppSVar22;
  StructSize SVar23;
  ulong uVar24;
  WirePointer *pWVar25;
  ushort uVar26;
  ulong uVar27;
  WirePointer *dst;
  AllocateResult AVar28;
  AllocateResult AVar29;
  Iterator __end5;
  Fault f;
  Iterator __end4;
  SegmentBuilder *local_d8;
  uint local_c8;
  WirePointer *local_c0;
  Fault local_b0;
  CapTableBuilder *local_a8;
  ulong local_a0;
  ulong local_98;
  WirePointer *local_90;
  ulong local_88;
  WirePointer *local_80;
  ListBuilder *local_78;
  SegmentBuilder *local_70;
  uint local_68;
  uint local_64;
  ulong local_60;
  OrphanBuilder *local_58;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar20 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar20 != 0) {
    pSVar8 = this->segment;
    pCVar19 = this->capTable;
    pBVar4 = (BuilderArena *)(pSVar8->super_SegmentReader).arena;
    if ((uVar20 & 3) == 2) {
      local_70 = BuilderArena::getSegment(pBVar4,id);
      uVar20 = (uint)(this->tag).content;
      pwVar13 = (local_70->super_SegmentReader).ptr.ptr;
      uVar27 = (ulong)(uVar20 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar13->content + uVar27);
      pOVar12 = (OrphanBuilder *)((long)&pwVar13[1].content + uVar27);
      if ((uVar20 & 4) == 0) {
        local_c0 = (WirePointer *)(&pOVar12->tag + ((int)(pOVar1->tag).content >> 2));
        pOVar12 = pOVar1;
      }
      else {
        local_70 = BuilderArena::getSegment
                             ((BuilderArena *)(local_70->super_SegmentReader).arena,
                              (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        local_c0 = (WirePointer *)
                   ((long)&((local_70->super_SegmentReader).ptr.ptr)->content +
                   (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      local_c0 = (WirePointer *)this->location;
      pOVar12 = this;
      local_70 = pSVar8;
    }
    if (local_70->readOnly == true) {
      SegmentBuilder::throwNotWritable(local_70);
    }
    if (((pOVar12->tag).content & 3) == 1) {
      uVar10 = (uint)elementSize >> 0x10;
      uVar20 = *(uint *)((long)&(pOVar12->tag).content + 4);
      bVar14 = (byte)uVar20 & 7;
      uVar26 = elementSize.data;
      uVar9 = elementSize.pointers;
      if (bVar14 == 7) {
        uVar20 = (uint)*(uint64_t *)&(local_c0->offsetAndKind).value;
        if ((uVar20 & 3) == 0) {
          pWVar16 = local_c0 + 1;
          uVar2 = *(ushort *)&local_c0->field_1;
          local_60 = (ulong)uVar2;
          uVar3 = *(ushort *)((long)&local_c0->field_1 + 2);
          local_38 = (ulong)uVar3;
          local_a0 = (ulong)((uint)uVar3 + (uint)uVar2);
          uVar20 = uVar20 >> 2 & 0x1fffffff;
          local_98 = (ulong)uVar20;
          SVar23.pointers = 0;
          SVar23.data = uVar2;
          if (uVar9 <= uVar3 && uVar26 <= uVar2) {
            __return_storage_ptr__->segment = local_70;
            __return_storage_ptr__->capTable = pCVar19;
            __return_storage_ptr__->ptr = (byte *)pWVar16;
            __return_storage_ptr__->elementCount = uVar20;
            __return_storage_ptr__->step = ((uint)uVar3 + (uint)uVar2) * 0x40;
            __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
            __return_storage_ptr__->structPointerCount = uVar3;
            goto LAB_001508c8;
          }
          if (uVar2 <= uVar26) {
            SVar23 = elementSize;
          }
          local_64 = (uint)uVar3;
          if (uVar9 < uVar3) {
            uVar10 = local_64;
          }
          local_68 = (uint)SVar23 & 0xffff;
          local_88 = (ulong)(uVar10 + local_68);
          uVar27 = local_88 * local_98;
          if (0x1ffffffe < uVar27) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_b0);
          }
          if ((((this->tag).content & 3) == 2) &&
             (pSVar7 = BuilderArena::getSegment
                                 ((BuilderArena *)(pSVar8->super_SegmentReader).arena,
                                  (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
             pSVar7->readOnly == false)) {
            uVar20 = (uint)(this->tag).content;
            puVar11 = (undefined8 *)
                      ((long)&((pSVar7->super_SegmentReader).ptr.ptr)->content +
                      (ulong)(uVar20 & 0xfffffff8));
            if ((uVar20 & 4) == 0) {
              *puVar11 = 0;
            }
            else {
              *puVar11 = 0;
              puVar11[1] = 0;
            }
          }
          (this->tag).content = 0;
          iVar18 = (int)uVar27;
          uVar20 = iVar18 + 1;
          pOVar12 = this;
          if (pBVar4 == (BuilderArena *)0x0) {
            pwVar13 = pSVar8->pos;
            AVar28.words = pwVar13;
            AVar28.segment = pSVar8;
            if (((long)((long)(pSVar8->super_SegmentReader).ptr.ptr +
                       ((pSVar8->super_SegmentReader).ptr.size_ * 8 - (long)pwVar13)) >> 3 <
                 (long)(ulong)uVar20) || (pSVar8->pos = pwVar13 + uVar20, pwVar13 == (word *)0x0)) {
              pBVar4 = (BuilderArena *)(pSVar8->super_SegmentReader).arena;
              local_a8 = pCVar19;
              if (0x1fffffff < iVar18 + 2U) {
                WireHelpers::allocate::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&local_b0);
              }
              AVar29 = BuilderArena::allocate(pBVar4,iVar18 + 2U);
              pOVar12 = (OrphanBuilder *)AVar29.words;
              pSVar8 = AVar29.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar29.words - *(int *)&(pSVar8->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar8->super_SegmentReader).id.value;
              *(undefined4 *)&(pOVar12->tag).content = 1;
              AVar28.words = (word *)&pOVar12->segment;
              AVar28.segment = pSVar8;
              pCVar19 = local_a8;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar13 - (long)this) >> 1) & 0xfffffffc) - 3;
            }
          }
          else {
            AVar28 = BuilderArena::allocate(pBVar4,uVar20);
            *(undefined4 *)&(this->tag).content = 0xfffffffd;
          }
          pwVar13 = AVar28.words;
          *(int *)((long)&(pOVar12->tag).content + 4) = iVar18 * 8 + 7;
          *(int *)&pwVar13->content = (int)local_98 * 4;
          *(StructDataWordCount *)((long)&pwVar13->content + 4) = SVar23.data;
          SVar5 = (StructPointerCount)uVar10;
          *(StructPointerCount *)((long)&pwVar13->content + 6) = SVar5;
          pWVar17 = (WirePointer *)(pwVar13 + 1);
          local_90 = pWVar17;
          if ((int)local_98 == 0) {
            uVar27 = local_a0 & 0xffffffff;
          }
          else {
            local_50 = (size_t)(uint)((int)local_60 << 3);
            local_40 = local_a0 & 0xffffffff;
            pWVar25 = (WirePointer *)(pwVar13 + (ulong)((uint)SVar23 & 0xffff) + 1);
            local_48 = (ulong)(uint)((int)local_88 * 8);
            pWVar15 = (WirePointer *)((long)&local_c0[1].offsetAndKind.value + local_50);
            local_a0 = (ulong)(uint)((int)local_a0 << 3);
            iVar18 = 0;
            local_a8 = pCVar19;
            local_78 = __return_storage_ptr__;
            local_58 = this;
            do {
              if ((short)local_60 != 0) {
                memcpy(pWVar17,pWVar16,local_50);
              }
              pSVar8 = local_70;
              src = pWVar15;
              uVar27 = local_38;
              dst = pWVar25;
              local_80 = pWVar17;
              if ((short)local_64 != 0) {
                do {
                  WireHelpers::transferPointer(AVar28.segment,dst,pSVar8,src);
                  dst = dst + 1;
                  src = src + 1;
                  uVar27 = uVar27 - 1;
                } while (uVar27 != 0);
              }
              pWVar17 = local_80 + local_88;
              pWVar16 = pWVar16 + local_40;
              iVar18 = iVar18 + 1;
              pWVar25 = (WirePointer *)((long)&(pWVar25->offsetAndKind).value + local_48);
              pWVar15 = (WirePointer *)((long)&(pWVar15->offsetAndKind).value + local_a0);
              pCVar19 = local_a8;
              this = local_58;
              __return_storage_ptr__ = local_78;
              uVar27 = local_40;
            } while (iVar18 != (int)local_98);
          }
          uVar27 = uVar27 * local_98;
          if (0x1ffffffe < uVar27) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_b0);
          }
          iVar18 = (int)uVar27 + 1;
          if (iVar18 != 0) {
            memset(local_c0,0,(ulong)(uint)(iVar18 * 8));
          }
          __return_storage_ptr__->segment = AVar28.segment;
          __return_storage_ptr__->capTable = pCVar19;
          __return_storage_ptr__->ptr = (byte *)local_90;
          __return_storage_ptr__->elementCount = (ListElementCount)local_98;
          __return_storage_ptr__->step = (int)local_88 << 6;
          __return_storage_ptr__->structDataSize = local_68 << 6;
LAB_0015084b:
          __return_storage_ptr__->structPointerCount = SVar5;
          pWVar16 = local_90;
          goto LAB_001508c8;
        }
        asStructList();
      }
      else {
        uVar6 = uVar20 >> 3;
        uVar27 = (ulong)uVar6;
        if ((uVar20 & 7) == 0) {
          local_c8 = (uint)elementSize & 0xffff;
          uVar10 = uVar10 + ((uint)elementSize & 0xffff);
          uVar27 = uVar10 * uVar27;
          local_a8 = pCVar19;
          local_78 = __return_storage_ptr__;
          if (0x1ffffffe < uVar27) {
            WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_b0);
          }
          if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
            WireHelpers::zeroObject(pSVar8,local_a8,(WirePointer *)this);
          }
          ppSVar22 = (SegmentBuilder **)pSVar8->pos;
          uVar24 = uVar27 + 1 & 0xffffffff;
          if (((long)((long)(pSVar8->super_SegmentReader).ptr.ptr +
                     ((pSVar8->super_SegmentReader).ptr.size_ * 8 - (long)ppSVar22)) >> 3 <
               (long)uVar24) ||
             (pSVar8->pos = (word *)(ppSVar22 + uVar24), ppSVar22 == (SegmentBuilder **)0x0)) {
            uVar20 = (int)uVar27 + 2;
            pBVar4 = (BuilderArena *)(pSVar8->super_SegmentReader).arena;
            if (0x1fffffff < uVar20) {
              WireHelpers::allocate::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_b0);
            }
            AVar29 = BuilderArena::allocate(pBVar4,uVar20);
            pOVar12 = (OrphanBuilder *)AVar29.words;
            pSVar8 = AVar29.segment;
            *(uint *)&(this->tag).content =
                 (int)AVar29.words - *(int *)&(pSVar8->super_SegmentReader).ptr.ptr & 0xfffffff8U |
                 2;
            *(uint *)((long)&(this->tag).content + 4) = (pSVar8->super_SegmentReader).id.value;
            *(undefined4 *)&(pOVar12->tag).content = 1;
            ppSVar22 = &pOVar12->segment;
          }
          else {
            *(uint *)&(this->tag).content =
                 ((uint)((ulong)((long)ppSVar22 - (long)this) >> 1) & 0xfffffffc) - 3;
            pOVar12 = this;
          }
          *(int *)((long)&(pOVar12->tag).content + 4) = (int)uVar27 * 8 + 7;
          *(uint *)ppSVar22 = uVar6 * 4;
          *(ushort *)((long)ppSVar22 + 4) = uVar26;
          *(ushort *)((long)ppSVar22 + 6) = uVar9;
          pWVar16 = (WirePointer *)(ppSVar22 + 1);
          local_78->segment = pSVar8;
          local_78->capTable = local_a8;
          local_78->ptr = (byte *)pWVar16;
          local_78->elementCount = uVar6;
          local_78->step = uVar10 * 0x40;
          local_78->structDataSize = local_c8 << 6;
          local_78->structPointerCount = uVar9;
          __return_storage_ptr__ = local_78;
          goto LAB_001508c8;
        }
        if (bVar14 != 1) {
          if (bVar14 == 6) {
            uVar10 = uVar10 + (uVar10 == 0);
          }
          else {
            elementSize = (StructSize)
                          (((uint)elementSize & 0xffff) + (uint)(((uint)elementSize & 0xffff) == 0))
            ;
          }
          local_a0 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)bVar14 * 4);
          local_98 = (ulong)((uint)elementSize & 0xffff);
          local_80 = (WirePointer *)(ulong)((uVar10 & 0xffff) + ((uint)elementSize & 0xffff));
          uVar24 = (long)local_80 * uVar27;
          local_a8 = pCVar19;
          local_88 = uVar27;
          local_78 = __return_storage_ptr__;
          if (0x1ffffffe < uVar24) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_b0);
          }
          if ((((this->tag).content & 3) == 2) &&
             (pSVar7 = BuilderArena::getSegment
                                 ((BuilderArena *)(pSVar8->super_SegmentReader).arena,
                                  (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
             pSVar7->readOnly == false)) {
            uVar21 = (uint)(this->tag).content;
            puVar11 = (undefined8 *)
                      ((long)&((pSVar7->super_SegmentReader).ptr.ptr)->content +
                      (ulong)(uVar21 & 0xfffffff8));
            if ((uVar21 & 4) == 0) {
              *puVar11 = 0;
            }
            else {
              *puVar11 = 0;
              puVar11[1] = 0;
            }
          }
          (this->tag).content = 0;
          iVar18 = (int)uVar24;
          uVar21 = iVar18 + 1;
          pOVar12 = this;
          if (pBVar4 == (BuilderArena *)0x0) {
            pwVar13 = pSVar8->pos;
            AVar29.words = pwVar13;
            AVar29.segment = pSVar8;
            if (((long)((long)(pSVar8->super_SegmentReader).ptr.ptr +
                       ((pSVar8->super_SegmentReader).ptr.size_ * 8 - (long)pwVar13)) >> 3 <
                 (long)(ulong)uVar21) || (pSVar8->pos = pwVar13 + uVar21, pwVar13 == (word *)0x0)) {
              pBVar4 = (BuilderArena *)(pSVar8->super_SegmentReader).arena;
              if (0x1fffffff < iVar18 + 2U) {
                WireHelpers::allocate::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&local_b0);
              }
              AVar29 = BuilderArena::allocate(pBVar4,iVar18 + 2U);
              pOVar12 = (OrphanBuilder *)AVar29.words;
              pSVar8 = AVar29.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar29.words - *(int *)&(pSVar8->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar8->super_SegmentReader).id.value;
              *(undefined4 *)&(pOVar12->tag).content = 1;
              AVar29.words = (word *)&pOVar12->segment;
              AVar29.segment = pSVar8;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar13 - (long)this) >> 1) & 0xfffffffc) - 3;
            }
          }
          else {
            AVar29 = BuilderArena::allocate(pBVar4,uVar21);
            *(undefined4 *)&(this->tag).content = 0xfffffffd;
          }
          pSVar8 = local_70;
          pwVar13 = AVar29.words;
          local_d8 = AVar29.segment;
          uVar21 = (uint)local_a0;
          pWVar16 = (WirePointer *)(pwVar13 + 1);
          *(int *)((long)&(pOVar12->tag).content + 4) = iVar18 * 8 + 7;
          *(uint *)&pwVar13->content = uVar6 * 4;
          *(StructDataWordCount *)((long)&pwVar13->content + 4) = elementSize.data;
          SVar5 = (StructPointerCount)uVar10;
          *(StructPointerCount *)((long)&pwVar13->content + 6) = SVar5;
          iVar18 = (int)local_80;
          local_90 = pWVar16;
          if (bVar14 == 6) {
            if (7 < uVar20) {
              pWVar16 = pWVar16 + local_98;
              pWVar17 = local_c0;
              do {
                WireHelpers::transferPointer(local_d8,pWVar16,pSVar8,pWVar17);
                pWVar17 = pWVar17 + 1;
                pWVar16 = (WirePointer *)
                          ((long)&(pWVar16->offsetAndKind).value + (ulong)(uint)(iVar18 * 8));
                uVar20 = (int)uVar27 - 1;
                uVar27 = (ulong)uVar20;
              } while (uVar20 != 0);
            }
          }
          else if (7 < uVar20) {
            uVar24 = (ulong)(uVar21 >> 3);
            pWVar17 = local_c0;
            do {
              if (0xfffffffffffffffb < (ulong)bVar14 - 6) {
                memcpy(pWVar16,pWVar17,uVar24);
              }
              pWVar17 = (WirePointer *)((long)&(pWVar17->offsetAndKind).value + uVar24);
              pWVar16 = (WirePointer *)
                        ((long)&(pWVar16->offsetAndKind).value + (ulong)(uint)(iVar18 * 8));
              uVar20 = (int)uVar27 - 1;
              uVar27 = (ulong)uVar20;
            } while (uVar20 != 0);
          }
          uVar24 = ((uint)(bVar14 == 6) * 0x40 + uVar21) * local_88;
          uVar27 = uVar24 + 0x3f;
          if (0x7ffffff80 < uVar24) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_b0);
          }
          __return_storage_ptr__ = local_78;
          pCVar19 = local_a8;
          if ((int)(uVar27 >> 6) != 0) {
            memset(local_c0,0,(ulong)((uint)(uVar27 >> 3) & 0xfffffff8));
          }
          __return_storage_ptr__->segment = local_d8;
          __return_storage_ptr__->capTable = pCVar19;
          __return_storage_ptr__->ptr = (byte *)local_90;
          __return_storage_ptr__->elementCount = uVar6;
          __return_storage_ptr__->step = (int)local_80 << 6;
          __return_storage_ptr__->structDataSize = (int)local_98 << 6;
          goto LAB_0015084b;
        }
        local_a8 = pCVar19;
        local_78 = __return_storage_ptr__;
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                  (&local_b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x603,FAILED,"oldSize != ElementSize::BIT",
                   "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                   ,(char (*) [106])
                    "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                  );
        kj::_::Debug::Fault::~Fault(&local_b0);
      }
    }
    else {
      asStructList();
    }
  }
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  pWVar16 = (WirePointer *)0x0;
LAB_001508c8:
  __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
  pOVar12 = (OrphanBuilder *)(pWVar16 + -1);
  if (pWVar16 == (WirePointer *)0x0) {
    pOVar12 = (OrphanBuilder *)0x0;
  }
  this->location = &pOVar12->tag;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asStructList(StructSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableStructListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = result.getLocation();

  return result;
}